

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.cc
# Opt level: O1

void google::protobuf::CaptureTestStdout(void)

{
  int __fd;
  Nonnull<const_char_*> failure_msg;
  int *piVar1;
  string_view str;
  AlphaNum *local_a8;
  Nonnull<std::unique_ptr<LogMessageData>_> local_a0;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> local_78;
  AlphaNum *local_70;
  long local_68 [2];
  string local_58;
  AlphaNum local_38;
  
  if ((long)original_stdout_ == -1) {
    failure_msg = (Nonnull<const_char_*>)0x0;
  }
  else {
    failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)original_stdout_,-1,"original_stdout_ == -1");
  }
  if (failure_msg == (Nonnull<const_char_*>)0x0) {
    TestTempDir_abi_cxx11_();
    local_a8 = local_70;
    local_a0._M_t.
    super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    ._M_t.
    super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
    _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                    )(__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                      )local_78._M_head_impl;
    local_38.piece_._M_len = 0x10;
    local_38.piece_._M_str = "/captured_stdout";
    absl::lts_20250127::StrCat_abi_cxx11_(&local_58,(lts_20250127 *)&local_a8,&local_38,local_70);
    std::__cxx11::string::operator=
              ((string *)&stdout_capture_filename__abi_cxx11_,(string *)&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (local_78._M_head_impl != (LogMessageData *)local_68) {
      operator_delete(local_78._M_head_impl,local_68[0] + 1);
    }
    __fd = open(stdout_capture_filename__abi_cxx11_,0xc1,0x1ff);
    if (-1 < __fd) {
      original_stdout_ = dup(1);
      close(1);
      dup2(__fd,1);
      close(__fd);
      return;
    }
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/testing/googletest.cc"
               ,0xa4,"fd >= 0");
    str._M_str = "open: ";
    str._M_len = 6;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              ((LogMessage *)&local_a8,str);
    piVar1 = __errno_location();
    local_38.piece_._M_len = (size_t)strerror(*piVar1);
    absl::lts_20250127::log_internal::LogMessage::operator<<<char_*,_0>
              ((LogMessage *)&local_a8,(char **)&local_38);
  }
  else {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/testing/googletest.cc"
               ,0x9e,failure_msg);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              ((LogMessage *)&local_a8,(char (*) [19])"Already capturing.");
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_a8);
}

Assistant:

void CaptureTestStdout() {
  ABSL_CHECK_EQ(original_stdout_, -1) << "Already capturing.";

  stdout_capture_filename_ = absl::StrCat(TestTempDir(), "/captured_stdout");

  int fd = open(stdout_capture_filename_.c_str(),
                O_WRONLY | O_CREAT | O_EXCL | O_BINARY, 0777);
  ABSL_CHECK(fd >= 0) << "open: " << strerror(errno);

  original_stdout_ = dup(1);
  close(1);
  dup2(fd, 1);
  close(fd);
}